

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_windows.cpp
# Opt level: O0

void __thiscall
Am_Drawonable_Impl::Bitblt
          (Am_Drawonable_Impl *this,int d_left,int d_top,int width,int height,Am_Drawonable *source,
          int s_left,int s_top,Am_Draw_Function df)

{
  GC p_Var1;
  Display *pDVar2;
  char *pcVar3;
  Window WVar4;
  Window dest_drawable;
  Window src_drawable;
  Display *disp;
  GC gc;
  Am_Drawonable *source_local;
  int height_local;
  int width_local;
  int d_top_local;
  int d_left_local;
  Am_Drawonable_Impl *this_local;
  
  p_Var1 = this->screen->gc;
  pDVar2 = this->screen->display;
  pcVar3 = source[1].title;
  WVar4 = this->xlib_drawable;
  set_gc_using_fill(this,&Am_No_Style,df,0);
  XCopyArea(pDVar2,pcVar3,WVar4,p_Var1,s_left,s_top,width,height,d_left,d_top);
  return;
}

Assistant:

void
Am_Drawonable_Impl::Bitblt(int d_left, int d_top, int width, int height,
                           Am_Drawonable *source, int s_left, int s_top,
                           Am_Draw_Function df)
{
  GC gc = screen->gc;
  Display *disp = screen->display;

  Window src_drawable = ((Am_Drawonable_Impl *)source)->xlib_drawable;
  Window dest_drawable = xlib_drawable;

  // a bit inefficient- only really need to change draw function.
  set_gc_using_fill(Am_No_Style, df);

  XCopyArea(disp, src_drawable, dest_drawable, gc, s_left, s_top, width, height,
            d_left, d_top);
}